

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setGroupingUsed(DecimalFormat *this,UBool enabled)

{
  DecimalFormatProperties *pDVar1;
  UBool enabled_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if ((int)enabled != (uint)(pDVar1->groupingUsed & 1)) {
    NumberFormat::setGroupingUsed(&this->super_NumberFormat,enabled);
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->groupingUsed = enabled != '\0';
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setGroupingUsed(UBool enabled) {
    if (UBOOL_TO_BOOL(enabled) == fields->properties->groupingUsed) { return; }
    NumberFormat::setGroupingUsed(enabled); // to set field for compatibility
    fields->properties->groupingUsed = enabled;
    touchNoError();
}